

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeTemperamentMeantone
          (MidiMessage *this,double fraction,int referencePitchClass,int channelMask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  allocator_type local_49;
  double local_48;
  vector<double,_std::allocator<double>_> temperament;
  
  local_48 = fraction;
  std::vector<double,_std::allocator<double>_>::vector(&temperament,0xc,&local_49);
  dVar4 = pow(1.0125,-local_48);
  dVar5 = log2(dVar4 * 1.5);
  dVar5 = dVar5 * 1200.0;
  *temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[7] = dVar5 + -700.0;
  dVar4 = dVar5 * 2.0 + -1400.0;
  auVar1._8_4_ = SUB84(dVar4,0);
  auVar1._0_8_ = dVar5 * -5.0 + 3500.0;
  auVar1._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *(undefined1 (*) [16])
   (temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start + 1) = auVar1;
  dVar4 = dVar5 * 3.0 + -2100.0;
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar5 * -4.0 + 2800.0;
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *(undefined1 (*) [16])
   (temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start + 8) = auVar2;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = dVar5 * -3.0 + 2100.0;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[4] = dVar5 * 4.0 + -2800.0;
  dVar4 = dVar5 * 5.0 + -3500.0;
  auVar3._8_4_ = SUB84(dVar4,0);
  auVar3._0_8_ = dVar5 * -2.0 + 1400.0;
  auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *(undefined1 (*) [16])
   (temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start + 10) = auVar3;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[5] = dVar5 * -1.0 + 700.0;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[6] = dVar5 * 6.0 + -4200.0;
  makeMts9_TemperamentByCentsDeviationFromET(this,&temperament,referencePitchClass,channelMask);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&temperament.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void MidiMessage::makeTemperamentMeantone(double fraction, int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2((3.0/2.0)*pow(81.0/80.0, -fraction));
	temperament[1]  = x * -5 + 3500; //  17.107 cents (for fraction = 0.25)
	temperament[8]  = x * -4 + 2800; //  13.686 cents (for fraction = 0.25)
	temperament[3]  = x * -3 + 2100; //  10.265 cents (for fraction = 0.25)
	temperament[10] = x * -2 + 1400; //   6.843 cents (for fraction = 0.25)
	temperament[5]  = x * -1 + 700;  //   3.422 cents (for fraction = 0.25)
	temperament[0]  = 0.0;           //   0     cents
	temperament[7]  = x *  1 - 700;  //  -3.422 cents (for fraction = 0.25)
	temperament[2]  = x *  2 - 1400; //  -6.843 cents (for fraction = 0.25)
	temperament[9]  = x *  3 - 2100; // -10.265 cents (for fraction = 0.25)
	temperament[4]  = x *  4 - 2800; // -13.686 cents (for fraction = 0.25)
	temperament[11] = x *  5 - 3500; // -17.107 cents (for fraction = 0.25)
	temperament[6]  = x *  6 - 4200; // -20.529 cents (for fraction = 0.25)
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}